

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::IncreaseCount
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t countInc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  charcount_t countInc_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  if (countInc != 0) {
    this->count = countInc + this->count;
    this->appendPtr = this->appendPtr + countInc;
    if (this->length <= this->count) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                  ,0x18a,"(this->count < this->length)","this->count < this->length"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void IncreaseCount(charcount_t countInc)
        {
            if(countInc == 0) return;

            this->count += countInc;
            this->appendPtr += countInc;
            Assert(this->count < this->length);
        }